

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_push.c
# Opt level: O0

ssize_t mpt_array_push(mpt_encode_array *arr,size_t len,void *data)

{
  mpt_buffer *pmVar1;
  size_t pos;
  long lVar2;
  ssize_t local_90;
  ssize_t local_88;
  size_t local_80;
  undefined1 local_78 [8];
  iovec src;
  ssize_t off;
  ssize_t cont;
  iovec dest_1;
  void *dest;
  ssize_t add;
  ssize_t max;
  mpt_buffer *b;
  void *data_local;
  size_t len_local;
  mpt_encode_array *arr_local;
  
  if (arr->_enc == (mpt_data_encoder_t)0x0) {
    if (len == 0) {
      (arr->_state).done = (arr->_state).scratch + (arr->_state).done;
      (arr->_state).scratch = 0;
      return 0;
    }
    if (data == (void *)0x0) {
      return -0x10;
    }
    pmVar1 = (arr->_d)._buf;
    if ((pmVar1 != (mpt_buffer *)0x0) && (pmVar1->_content_traits != (mpt_type_traits *)0x0)) {
      return -3;
    }
    pos = (arr->_state).done + (arr->_state).scratch;
    dest_1.iov_len = (size_t)mpt_array_insert(&arr->_d,pos,len);
    if ((void *)dest_1.iov_len == (void *)0x0) {
      return -0x11;
    }
    pmVar1 = (arr->_d)._buf;
    memcpy((void *)dest_1.iov_len,data,len);
    (arr->_state).scratch = len + (arr->_state).scratch;
    pmVar1->_used = pos + len;
    return len;
  }
  lVar2 = (arr->_state).done + (arr->_state).scratch;
  local_80 = len;
  if (len < 0x41) {
    local_80 = 0x40;
  }
  pmVar1 = (arr->_d)._buf;
  if (pmVar1 == (mpt_buffer *)0x0) {
    if (lVar2 != 0) {
      return -1;
    }
    max = (ssize_t)_mpt_buffer_alloc(local_80,0);
    if ((mpt_buffer *)max == (mpt_buffer *)0x0) {
      return -4;
    }
    (arr->_d)._buf = (mpt_buffer *)max;
  }
  else {
    if (pmVar1->_content_traits != (mpt_type_traits *)0x0) {
      return -3;
    }
    max = (ssize_t)(*pmVar1->_vptr->detach)(pmVar1,lVar2 + local_80);
    if ((mpt_buffer *)max == (mpt_buffer *)0x0) {
      return -4;
    }
    (arr->_d)._buf = (mpt_buffer *)max;
  }
  add = 0;
  b = (mpt_buffer *)data;
  data_local = (void *)len;
  while( true ) {
    while( true ) {
      src.iov_len = *(long *)(max + 0x18) - ((arr->_state).done + (arr->_state).scratch);
      if ((long)src.iov_len < 0) {
        return -1;
      }
      cont = max + 0x20 + src.iov_len;
      dest_1.iov_base = (void *)(*(long *)(max + 0x10) - src.iov_len);
      if (data_local == (void *)0x0) {
        off = (*arr->_enc)(&arr->_state,(iovec *)&cont,(iovec *)0x0);
      }
      else {
        local_78 = (undefined1  [8])b;
        src.iov_base = data_local;
        off = (*arr->_enc)(&arr->_state,(iovec *)&cont,(iovec *)local_78);
      }
      src.iov_len = (arr->_state).done + (arr->_state).scratch + src.iov_len;
      if (*(ulong *)(max + 0x10) < src.iov_len) {
        mpt_log((mpt_logger *)0x0,"mpt_array_push",1,"%s: %zi > %zu","invalid encoder data size",
                src.iov_len,*(undefined8 *)(max + 0x10));
        (*arr->_enc)(&arr->_state,(iovec *)0x0,(iovec *)0x0);
        return -8;
      }
      *(size_t *)(max + 0x18) = src.iov_len;
      if (off != -0x11) break;
      max = (**(code **)(*(long *)max + 0x18))(max,*(long *)(max + 0x10) + 0x40);
      if ((mpt_buffer *)max == (mpt_buffer *)0x0) {
        if (add == 0) {
          local_88 = -0x11;
        }
        else {
          local_88 = add;
        }
        return local_88;
      }
      (arr->_d)._buf = (mpt_buffer *)max;
    }
    if (off < 0) {
      if (add == 0) {
        local_90 = off;
      }
      else {
        local_90 = add;
      }
      return local_90;
    }
    if ((b == (mpt_buffer *)0x0) || (data_local == (void *)0x0)) break;
    if (data_local < (ulong)off) {
      mpt_log((mpt_logger *)0x0,"mpt_array_push",2,"%s: %zi > %zu","bad encoder return size",off,
              data_local);
      (*arr->_enc)(&arr->_state,(iovec *)0x0,(iovec *)0x0);
      return -8;
    }
    data_local = (void *)((long)data_local - off);
    if (data_local == (void *)0x0) {
      return add + off;
    }
    b = (mpt_buffer *)((long)&b->_vptr + off);
    add = off + add;
  }
  return add + off;
}

Assistant:

extern ssize_t mpt_array_push(MPT_STRUCT(encode_array) *arr, size_t len, const void *data)
{
	MPT_STRUCT(buffer) *b;
	ssize_t max, add;
	
	/* fast path for raw data */
	if (!arr->_enc) {
		void *dest;
		if (!len) {
			arr->_state.done += arr->_state.scratch;
			arr->_state.scratch = 0;
			return 0;
		}
		if (!data) {
			return MPT_ERROR(MissingData);
		}
		if ((b = arr->_d._buf)
		    && b->_content_traits) {
			return MPT_ERROR(BadType);
		}
		max = arr->_state.done + arr->_state.scratch;
		if (!(dest = mpt_array_insert(&arr->_d, max, len))) {
			return MPT_ERROR(MissingBuffer);
		}
		b = arr->_d._buf;
		memcpy(dest, data, len);
		arr->_state.scratch += len;
		b->_used = max + len;
		
		return len;
	}
	max = arr->_state.done + arr->_state.scratch;
	add = len > 64 ? len : 64;
	
	/* current buffer data */
	if (!(b = arr->_d._buf)) {
		if (max) {
			return MPT_ERROR(BadArgument);
		}
		/* use initial data size */
		if (!(b = _mpt_buffer_alloc(add, 0))) {
			return MPT_ERROR(BadOperation);
		}
		arr->_d._buf = b;
	}
	else if (b->_content_traits) {
		return MPT_ERROR(BadType);
	}
	else if (!(b = b->_vptr->detach(b, max + add))) {
		return MPT_ERROR(BadOperation);
	}
	else {
		arr->_d._buf = b;
	}
	max = 0;
	
	while (1) {
		struct iovec dest;
		ssize_t cont, off;
		
		off = arr->_state.done + arr->_state.scratch;
		
		if ((off = b->_used - off) < 0) {
			return MPT_ERROR(BadArgument);
		}
		dest.iov_base = ((uint8_t *) (b + 1)) + off;
		dest.iov_len  = b->_size - off;
		
		/* next regular operation */
		if (!len) {
			cont = arr->_enc(&arr->_state, &dest, 0);
		} else {
			struct iovec src;
			src.iov_base = (void *) data;
			src.iov_len  = len;
			cont = arr->_enc(&arr->_state, &dest, &src);
		}
		off += arr->_state.done + arr->_state.scratch;
		
		/* size update */
		if (b->_size < (size_t) off) {
			mpt_log(0, __func__, MPT_LOG(Fatal), "%s: %zi > %zu",
			        MPT_tr("invalid encoder data size"), off, (size_t) b->_size);
			arr->_enc(&arr->_state, 0, 0);
			return MPT_ERROR(BadEncoding);
		}
		b->_used = off;
		
		/* require larger buffer */
		if (cont == MPT_ERROR(MissingBuffer)) {
			if (!(b = b->_vptr->detach(b, b->_size + 64))) {
				return max ? max : MPT_ERROR(MissingBuffer);
			}
			arr->_d._buf = b;
			continue;
		}
		if (cont < 0) {
			return max ? max : cont;
		}
		/* positive no error except for incomplete write */
		if (!data || !len) {
			return max + cont;
		}
		/* space error */
		if (len < (size_t) cont) {
			mpt_log(0, __func__, MPT_LOG(Critical), "%s: %zi > %zu",
			        MPT_tr("bad encoder return size"), cont, len);
			arr->_enc(&arr->_state, 0, 0);
			return MPT_ERROR(BadEncoding);
		}
		/* all data processed */
		if (!(len -= cont)) {
			return max + cont;
		}
		/* advance source data offset */
		data = ((uint8_t *) data) + cont;
		max += cont;
	}
}